

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void CPP::generateMultiDirectiveBegin(QTextStream *outputStream,QSet<QString> *directives)

{
  QStringView name;
  QStringView name_00;
  QStringView name_01;
  bool bVar1;
  qsizetype qVar2;
  QTextStream *s;
  QStringView *this;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype size;
  qsizetype i;
  QList<QString> list;
  qtConfig *in_stack_ffffffffffffff28;
  QList<QString> *in_stack_ffffffffffffff30;
  QString *in_stack_ffffffffffffff38;
  iterator in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  storage_type_conflict *psVar3;
  openQtConfig *in_stack_ffffffffffffff50;
  QTextStream *in_stack_ffffffffffffff58;
  QList<QString> local_50 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSet<QString>::isEmpty((QSet<QString> *)0x1426dc);
  if (!bVar1) {
    qVar2 = QSet<QString>::size((QSet<QString> *)0x1426f1);
    if (qVar2 == 1) {
      QSet<QString>::cbegin((QSet<QString> *)in_stack_ffffffffffffff48.i);
      QSet<QString>::const_iterator::operator*((const_iterator *)0x142720);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_ffffffffffffff40.i,(QString *)in_RDI);
      name.m_data = (storage_type_conflict *)in_stack_ffffffffffffff48.i;
      name.m_size = (qsizetype)in_stack_ffffffffffffff40.i;
      language::openQtConfig::openQtConfig((openQtConfig *)in_stack_ffffffffffffff28,name);
      language::operator<<(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    }
    else {
      local_50[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_50[0].d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_50[0].d.size = -0x5555555555555556;
      QSet<QString>::values((QSet<QString> *)in_stack_ffffffffffffff40.i);
      QList<QString>::begin(in_stack_ffffffffffffff30);
      QList<QString>::end(in_stack_ffffffffffffff30);
      std::sort<QList<QString>::iterator>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      s = (QTextStream *)QTextStream::operator<<(in_RDI,"#if ");
      QList<QString>::constFirst((QList<QString> *)s);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_ffffffffffffff40.i,in_stack_ffffffffffffff38);
      name_00.m_data = (storage_type_conflict *)in_stack_ffffffffffffff48.i;
      name_00.m_size = (qsizetype)in_stack_ffffffffffffff40.i;
      language::qtConfig::qtConfig(in_stack_ffffffffffffff28,name_00);
      language::operator<<
                ((QTextStream *)in_stack_ffffffffffffff40.i,(qtConfig *)in_stack_ffffffffffffff38);
      psVar3 = (storage_type_conflict *)0x1;
      this = (QStringView *)QList<QString>::size(local_50);
      for (; (long)psVar3 < (long)this; psVar3 = (storage_type_conflict *)((long)psVar3 + 1)) {
        in_stack_ffffffffffffff28 = (qtConfig *)QTextStream::operator<<(in_RDI," || ");
        QList<QString>::at((QList<QString> *)s,(qsizetype)in_stack_ffffffffffffff28);
        QStringView::QStringView<QString,_true>(this,in_stack_ffffffffffffff38);
        name_01.m_data = psVar3;
        name_01.m_size = (qsizetype)this;
        language::qtConfig::qtConfig(in_stack_ffffffffffffff28,name_01);
        language::operator<<((QTextStream *)this,(qtConfig *)in_stack_ffffffffffffff38);
      }
      ::operator<<(s,(QTextStreamFunction)in_stack_ffffffffffffff28);
      QList<QString>::~QList((QList<QString> *)0x1428d4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void generateMultiDirectiveBegin(QTextStream &outputStream, const QSet<QString> &directives)
{
    if (directives.isEmpty())
        return;

    if (directives.size() == 1) {
        outputStream << language::openQtConfig(*directives.cbegin());
        return;
    }

    auto list = directives.values();
    // sort (always generate in the same order):
    std::sort(list.begin(), list.end());

    outputStream << "#if " << language::qtConfig(list.constFirst());
    for (qsizetype i = 1, size = list.size(); i < size; ++i)
        outputStream << " || " << language::qtConfig(list.at(i));
    outputStream << Qt::endl;
}